

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O1

int __thiscall VVCStreamReader::intDecodeNAL(VVCStreamReader *this,uint8_t *buff)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  VvcSpsUnit *pVVar4;
  VvcPpsUnit *pVVar5;
  byte bVar6;
  byte *end;
  int iVar7;
  bool bVar8;
  MemoryBlock *dst;
  bool bVar9;
  byte *pbVar10;
  uint uVar11;
  uint uVar12;
  byte *local_50;
  
  iVar7 = 0;
  (this->super_MPEGStreamReader).m_spsPpsFound = false;
  this->m_lastIFrame = false;
  pbVar3 = NALUnit::findNextNAL
                     (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  if (((this->super_MPEGStreamReader).m_eof != false) ||
     (iVar7 = -10, pbVar3 != (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd)) {
    bVar8 = false;
    local_50 = (byte *)0x0;
    do {
      pbVar10 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
      if (pbVar10 <= buff) {
        if ((this->super_MPEGStreamReader).m_eof != true) {
          return 1;
        }
        (this->super_MPEGStreamReader).m_lastDecodedPos = pbVar10;
        return 0;
      }
      uVar11 = (uint)(*buff >> 1);
      uVar12 = uVar11 & 0x3f;
      pVVar4 = this->m_sps;
      pVVar5 = this->m_pps;
      bVar6 = (byte)uVar12;
      bVar9 = bVar8;
      if (pVVar5 == (VvcPpsUnit *)0x0 || pVVar4 == (VvcSpsUnit *)0x0) {
LAB_001f29da:
        if (bVar8) {
          incTimings(this);
          (this->super_MPEGStreamReader).m_lastDecodedPos = local_50;
          bVar6 = 0;
          pbVar10 = buff;
          iVar7 = 0;
        }
        else {
          pbVar10 = pbVar3 + -3;
          if (pbVar3[-4] == 0) {
            pbVar10 = pbVar3 + -4;
          }
          bVar1 = true;
          if (bVar6 == 0x10) {
            if (pVVar5 == (VvcPpsUnit *)0x0) {
              pVVar5 = (VvcPpsUnit *)operator_new(0x40);
              VvcPpsUnit::VvcPpsUnit(pVVar5);
              this->m_pps = pVVar5;
            }
            VvcUnit::decodeBuffer(&this->m_pps->super_VvcUnit,buff,pbVar10);
            iVar2 = VvcPpsUnit::deserialize(this->m_pps);
            if (iVar2 == 0) {
              (this->super_MPEGStreamReader).m_spsPpsFound = true;
              dst = &this->m_ppsBuffer;
              goto LAB_001f2c65;
            }
LAB_001f2bfb:
            bVar1 = false;
            iVar7 = iVar2;
          }
          else {
            if (uVar12 == 0xf) {
              if (pVVar4 == (VvcSpsUnit *)0x0) {
                pVVar4 = (VvcSpsUnit *)operator_new(0xa8);
                VvcSpsUnit::VvcSpsUnit(pVVar4);
                this->m_sps = pVVar4;
              }
              VvcUnit::decodeBuffer((VvcUnit *)this->m_sps,buff,pbVar10);
              iVar2 = VvcSpsUnit::deserialize(this->m_sps);
              if (iVar2 != 0) goto LAB_001f2bfb;
              (this->super_MPEGStreamReader).m_spsPpsFound = true;
              MPEGStreamReader::updateFPS(&this->super_MPEGStreamReader,this->m_sps,buff,pbVar10,0);
              dst = &this->m_spsBuffer;
            }
            else {
              if (uVar12 != 0xe) goto LAB_001f2c76;
              VvcUnit::decodeBuffer((VvcUnit *)this->m_vps,buff,pbVar10);
              iVar2 = VvcVpsUnit::deserialize(this->m_vps);
              if (iVar2 != 0) goto LAB_001f2bfb;
              (this->super_MPEGStreamReader).m_spsPpsFound = true;
              this->m_vpsCounter = this->m_vpsCounter + 1;
              this->m_vpsSizeDiff = 0;
              if (this->m_vps->num_units_in_tick != 0) {
                MPEGStreamReader::updateFPS
                          (&this->super_MPEGStreamReader,this->m_vps,buff,pbVar10,0);
              }
              pbVar3 = pbVar3 + this->m_vpsSizeDiff;
              dst = &this->m_vpsBuffer;
            }
LAB_001f2c65:
            storeBuffer(dst,buff,pbVar10);
            bVar1 = true;
          }
LAB_001f2c76:
          pbVar10 = pbVar3;
          if (bVar1) goto LAB_001f2c7d;
          bVar6 = 0;
          pbVar10 = buff;
        }
      }
      else {
        pbVar10 = pbVar3;
        if ((uVar12 < 0xb) && ((0x78fU >> (uVar11 & 0x1f) & 1) != 0)) {
          bVar9 = true;
          if ((char)buff[2] < '\0') {
            if (bVar8) {
              (this->super_MPEGStreamReader).m_lastDecodedPos = local_50;
              incTimings(this);
              iVar2 = 0;
            }
            else {
              end = buff + 0x40;
              if (pbVar3 < buff + 0x40) {
                end = pbVar3;
              }
              VvcUnit::decodeBuffer(&this->m_slice->super_VvcUnit,buff,end);
              iVar2 = VvcSliceHeader::deserialize(this->m_slice,this->m_sps,this->m_pps);
              if (iVar2 == 0) {
                if (6 < bVar6) {
                  this->m_lastIFrame = true;
                }
                iVar2 = toFullPicOrder(this,this->m_slice,
                                       (uint)this->m_sps->log2_max_pic_order_cnt_lsb);
                this->m_fullPicOrder = iVar2;
                goto LAB_001f2c7d;
              }
            }
            bVar6 = 0;
            pbVar10 = buff;
            iVar7 = iVar2;
            goto LAB_001f2cb0;
          }
        }
        else if ((pVVar5 == (VvcPpsUnit *)0x0 || pVVar4 == (VvcSpsUnit *)0x0) ||
                ((0x1f < bVar6 || ((0xcb640000U >> (uVar11 & 0x1f) & 1) == 0)))) goto LAB_001f29da;
LAB_001f2c7d:
        pbVar3 = NALUnit::findNextNAL
                           (pbVar10,(this->super_MPEGStreamReader).super_AbstractStreamReader.
                                    m_bufEnd);
        bVar6 = pbVar3 != (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd |
                (this->super_MPEGStreamReader).m_eof;
        local_50 = buff;
        bVar8 = bVar9;
        if (bVar6 == 0) {
          iVar7 = -10;
        }
      }
LAB_001f2cb0:
      buff = pbVar10;
    } while (bVar6 != 0);
  }
  return iVar7;
}

Assistant:

int VVCStreamReader::intDecodeNAL(uint8_t* buff)
{
    int rez;
    bool sliceFound = false;
    m_spsPpsFound = false;
    m_lastIFrame = false;

    const uint8_t* prevPos = nullptr;
    uint8_t* curPos = buff;
    uint8_t* nextNal = NALUnit::findNextNAL(curPos, m_bufEnd);

    if (!m_eof && nextNal == m_bufEnd)
        return NOT_ENOUGH_BUFFER;

    while (curPos < m_bufEnd)
    {
        const auto nalType = static_cast<VvcUnit::NalType>((*curPos >> 1) & 0x3f);
        if (isSlice(nalType))
        {
            if (curPos[2] & 0x80)  // slice.first_slice
            {
                if (sliceFound)
                {  // first slice of next frame: case where there is no non-VCL NAL between the two frames
                    m_lastDecodedPos = prevPos;  // next frame started
                    incTimings();
                    return 0;
                }
                // first slice of current frame
                m_slice->decodeBuffer(curPos, FFMIN(curPos + MAX_SLICE_HEADER, nextNal));
                rez = m_slice->deserialize(m_sps, m_pps);
                if (rez)
                    return rez;  // not enough buffer or error
                if (nalType >= VvcUnit::NalType::IDR_W_RADL)
                    m_lastIFrame = true;
                m_fullPicOrder = toFullPicOrder(m_slice, m_sps->log2_max_pic_order_cnt_lsb);
            }
            sliceFound = true;
        }
        else if (!isSuffix(nalType))
        {  // first non-VCL prefix NAL (AUD, SEI...) following current frame
            if (sliceFound)
            {
                incTimings();
                m_lastDecodedPos = prevPos;  // next frame started
                return 0;
            }

            uint8_t* nextNalWithStartCode = nextNal[-4] == 0 ? nextNal - 4 : nextNal - 3;

            switch (nalType)
            {
            case VvcUnit::NalType::VPS:
                m_vps->decodeBuffer(curPos, nextNalWithStartCode);
                rez = m_vps->deserialize();
                if (rez)
                    return rez;
                m_spsPpsFound = true;
                m_vpsCounter++;
                m_vpsSizeDiff = 0;
                if (m_vps->num_units_in_tick)
                    updateFPS(m_vps, curPos, nextNalWithStartCode, 0);
                nextNal += m_vpsSizeDiff;
                storeBuffer(m_vpsBuffer, curPos, nextNalWithStartCode);
                break;
            case VvcUnit::NalType::SPS:
                if (!m_sps)
                    m_sps = new VvcSpsUnit();
                m_sps->decodeBuffer(curPos, nextNalWithStartCode);
                rez = m_sps->deserialize();
                if (rez)
                    return rez;
                m_spsPpsFound = true;
                updateFPS(m_sps, curPos, nextNalWithStartCode, 0);
                storeBuffer(m_spsBuffer, curPos, nextNalWithStartCode);
                break;
            case VvcUnit::NalType::PPS:
                if (!m_pps)
                    m_pps = new VvcPpsUnit();
                m_pps->decodeBuffer(curPos, nextNalWithStartCode);
                rez = m_pps->deserialize();
                if (rez)
                    return rez;
                m_spsPpsFound = true;
                storeBuffer(m_ppsBuffer, curPos, nextNalWithStartCode);
                break;
            default:
                break;
            }
        }
        prevPos = curPos;
        curPos = nextNal;
        nextNal = NALUnit::findNextNAL(curPos, m_bufEnd);

        if (!m_eof && nextNal == m_bufEnd)
            return NOT_ENOUGH_BUFFER;
    }
    if (m_eof)
    {
        m_lastDecodedPos = m_bufEnd;
        return 0;
    }
    return NEED_MORE_DATA;
}